

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorTemplateBase<std::pair<unsigned_long,_llvm::DILineInfo>,_false>::grow
          (SmallVectorTemplateBase<std::pair<unsigned_long,_llvm::DILineInfo>,_false> *this,
          size_t MinSize)

{
  undefined8 *puVar1;
  SmallVectorTemplateBase<std::pair<unsigned_long,_llvm::DILineInfo>,_false> *__ptr;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  pair<unsigned_long,_llvm::DILineInfo> *ppVar6;
  ulong uVar7;
  undefined8 *__size;
  pair<unsigned_long,_llvm::DILineInfo> *__cur;
  pair<unsigned_long,_llvm::DILineInfo> *this_00;
  long lVar8;
  pair<unsigned_long,_llvm::DILineInfo> *S;
  
  if (MinSize >> 0x20 != 0) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar5 = (ulong)(this->
                 super_SmallVectorTemplateCommon<std::pair<unsigned_long,_llvm::DILineInfo>,_void>).
                 super_SmallVectorBase.Capacity + 2;
  uVar7 = uVar5 >> 1 | uVar5;
  uVar7 = uVar7 >> 2 | uVar7;
  uVar7 = uVar7 >> 4 | uVar7;
  uVar7 = uVar7 >> 8 | uVar7;
  uVar5 = (uVar5 >> 0x20 | uVar7 >> 0x10 | uVar7) + 1;
  if (uVar5 <= MinSize) {
    uVar5 = MinSize;
  }
  if (0xfffffffe < uVar5) {
    uVar5 = 0xffffffff;
  }
  __size = (undefined8 *)(uVar5 * 0x70);
  ppVar6 = (pair<unsigned_long,_llvm::DILineInfo> *)malloc((size_t)__size);
  if (ppVar6 != (pair<unsigned_long,_llvm::DILineInfo> *)0x0) {
    S = (pair<unsigned_long,_llvm::DILineInfo> *)
        (this->super_SmallVectorTemplateCommon<std::pair<unsigned_long,_llvm::DILineInfo>,_void>).
        super_SmallVectorBase.BeginX;
    uVar7 = (ulong)(this->
                   super_SmallVectorTemplateCommon<std::pair<unsigned_long,_llvm::DILineInfo>,_void>
                   ).super_SmallVectorBase.Size;
    if (uVar7 == 0) {
      uVar7 = 0;
    }
    else {
      lVar8 = uVar7 * 0x70;
      this_00 = ppVar6;
      do {
        std::pair<unsigned_long,_llvm::DILineInfo>::pair(this_00,S);
        S = S + 1;
        this_00 = this_00 + 1;
        lVar8 = lVar8 + -0x70;
      } while (lVar8 != 0);
      S = (pair<unsigned_long,_llvm::DILineInfo> *)
          (this->super_SmallVectorTemplateCommon<std::pair<unsigned_long,_llvm::DILineInfo>,_void>).
          super_SmallVectorBase.BeginX;
      uVar7 = (ulong)(this->
                     super_SmallVectorTemplateCommon<std::pair<unsigned_long,_llvm::DILineInfo>,_void>
                     ).super_SmallVectorBase.Size;
    }
    destroy_range(S,S + uVar7);
    __ptr = (SmallVectorTemplateBase<std::pair<unsigned_long,_llvm::DILineInfo>,_false> *)
            (this->super_SmallVectorTemplateCommon<std::pair<unsigned_long,_llvm::DILineInfo>,_void>
            ).super_SmallVectorBase.BeginX;
    if (__ptr != this + 1) {
      free(__ptr);
    }
    (this->super_SmallVectorTemplateCommon<std::pair<unsigned_long,_llvm::DILineInfo>,_void>).
    super_SmallVectorBase.BeginX = ppVar6;
    (this->super_SmallVectorTemplateCommon<std::pair<unsigned_long,_llvm::DILineInfo>,_void>).
    super_SmallVectorBase.Capacity = (uint)uVar5;
    return;
  }
  SmallVectorTemplateBase<std::pair<unsigned_long,llvm::DILineInfo>,false>::grow();
  *__size = *(undefined8 *)MinSize;
  __size[1] = __size + 3;
  puVar1 = (undefined8 *)(MinSize + 0x18);
  if (*(undefined8 **)(MinSize + 8) == puVar1) {
    uVar2 = *(undefined8 *)(MinSize + 0x20);
    __size[3] = *puVar1;
    __size[4] = uVar2;
  }
  else {
    __size[1] = *(undefined8 **)(MinSize + 8);
    __size[3] = *puVar1;
  }
  __size[2] = *(undefined8 *)(MinSize + 0x10);
  *(undefined8 **)(MinSize + 8) = puVar1;
  *(undefined8 *)(MinSize + 0x10) = 0;
  *(undefined1 *)(MinSize + 0x18) = 0;
  __size[5] = __size + 7;
  puVar1 = (undefined8 *)(MinSize + 0x38);
  if (*(undefined8 **)(MinSize + 0x28) == puVar1) {
    uVar2 = *(undefined8 *)(MinSize + 0x40);
    __size[7] = *puVar1;
    __size[8] = uVar2;
  }
  else {
    __size[5] = *(undefined8 **)(MinSize + 0x28);
    __size[7] = *puVar1;
  }
  __size[6] = *(undefined8 *)(MinSize + 0x30);
  *(undefined8 **)(MinSize + 0x28) = puVar1;
  *(undefined8 *)(MinSize + 0x30) = 0;
  *(undefined1 *)(MinSize + 0x38) = 0;
  __size[0xd] = *(undefined8 *)(MinSize + 0x68);
  uVar2 = *(undefined8 *)(MinSize + 0x48);
  uVar3 = *(undefined8 *)(MinSize + 0x50);
  uVar4 = *(undefined8 *)(MinSize + 0x60);
  __size[0xb] = *(undefined8 *)(MinSize + 0x58);
  __size[0xc] = uVar4;
  __size[9] = uVar2;
  __size[10] = uVar3;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, TriviallyCopyable>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}